

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O1

void __thiscall
bk_lib::pod_vector<Clasp::VsidsScore,_std::allocator<Clasp::VsidsScore>_>::reserve
          (pod_vector<Clasp::VsidsScore,_std::allocator<Clasp::VsidsScore>_> *this,size_type n)

{
  pointer pVVar1;
  VsidsScore *__dest;
  
  if ((this->ebo_).cap < n) {
    __dest = __gnu_cxx::new_allocator<Clasp::VsidsScore>::allocate
                       ((new_allocator<Clasp::VsidsScore> *)this,(ulong)n,(void *)0x0);
    pVVar1 = (this->ebo_).buf;
    if (pVVar1 != (pointer)0x0) {
      memcpy(__dest,pVVar1,(ulong)(this->ebo_).size << 3);
    }
    pVVar1 = (this->ebo_).buf;
    if (pVVar1 != (pointer)0x0) {
      operator_delete(pVVar1);
    }
    (this->ebo_).buf = __dest;
    (this->ebo_).cap = n;
  }
  return;
}

Assistant:

void reserve(size_type n) {
		if (n > capacity()) {
			T* temp = ebo_.allocate(n);
			if (ebo_.buf) {
				std::memcpy(temp, ebo_.buf, size()*sizeof(T));
			}
			ebo_.release();
			ebo_.buf = temp;
			ebo_.cap = n;
		}
	}